

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::VBInt>::readFrom
          (Property<Protocol::MQTT::Common::VBInt> *this,uint8 *buffer,uint32 bufLength)

{
  ushort uVar1;
  ushort uVar2;
  
  if ((-1 < (char)*buffer) && (*buffer == (this->super_PropertyBase).type)) {
    if (bufLength < 2) {
      return 0xfffffffe;
    }
    (this->value).size = 0;
    uVar2 = 0;
    do {
      if (bufLength - 1 <= (uint)uVar2) {
        return 0xfffffffe;
      }
      (this->value).field_0.value[uVar2] = buffer[(ulong)uVar2 + 1];
      uVar1 = (this->value).size;
      uVar2 = uVar1 + 1;
      (this->value).size = uVar2;
      if (-1 < (char)(this->value).field_0.value[uVar1]) {
        return uVar2 + 1;
      }
    } while (uVar2 != 4);
  }
  return 0xffffffff;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if ((buffer[0] & 0x80) || buffer[0] != type) return BadData;
                    if (bufLength < 2) return NotEnoughData;
                    uint32 o = value.readFrom(buffer+1, bufLength - 1);
                    if (isError(o)) return o;
                    return o+1;
                }